

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp-getelement2.cpp
# Opt level: O0

Object * ICM::getIdentData(Element *elt)

{
  bool bVar1;
  FuncTableUnit *this;
  size_t id;
  Element *pEVar2;
  IdentIndex *index;
  IdentTableUnit *pIVar3;
  TypeType local_40 [3];
  FunctionType local_28;
  Element *local_18;
  Element *elt_local;
  
  local_18 = elt;
  bVar1 = Instruction::Element::isIdentType(elt,I_DyVarb);
  if (bVar1) {
    elt_local = (Element *)getDyVarbData(local_18);
  }
  else {
    bVar1 = Instruction::Element::isIdentType(local_18,I_Data);
    if (bVar1) {
      elt_local = (Element *)getConstData(local_18);
    }
    else {
      bVar1 = Instruction::Element::isIdentType(local_18,I_StFunc);
      if (bVar1) {
        pEVar2 = (Element *)operator_new(0x10);
        this = getStFunc(local_18);
        id = FuncTableUnit::getID(this);
        TypeBase::FunctionType::FunctionType(&local_28,id);
        Objects::DataObject<(ICM::DefaultType)11>::DataObject
                  ((DataObject<(ICM::DefaultType)11> *)pEVar2,&local_28);
        elt_local = pEVar2;
      }
      else {
        bVar1 = Instruction::Element::isIdentType(local_18,I_Type);
        if (bVar1) {
          pEVar2 = (Element *)operator_new(0x10);
          index = Instruction::Element::getIdentIndex(local_18);
          pIVar3 = getFromIdentTable(index);
          TypeBase::TypeType::TypeType(local_40,(pIVar3->field_3).TypeIndex);
          Objects::DataObject<(ICM::DefaultType)14>::DataObject
                    ((DataObject<(ICM::DefaultType)14> *)pEVar2,local_40);
          elt_local = pEVar2;
        }
        else {
          elt_local = (Element *)0x0;
        }
      }
    }
  }
  return (Object *)elt_local;
}

Assistant:

Object* getIdentData(const Instruction::Element &elt) {
		if (elt.isIdentType(I_DyVarb)) {
			return getDyVarbData(elt);
		}
		else if (elt.isIdentType(I_Data)) {
			return getConstData(elt);
		}
		else if (elt.isIdentType(I_StFunc)) {
			return new Objects::Function(getStFunc(elt).getID());
		}
		else if (elt.isIdentType(I_Type)) {
			return new Objects::Type(getFromIdentTable(elt.getIdentIndex()).TypeIndex);
		}
		return nullptr;
	}